

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::AnimatedPrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,AnimatedPrimitive *this,Ray *r,
          Float tMax)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Interval<float> IVar5;
  Interval<float> IVar6;
  Interval<float> IVar7;
  undefined1 auVar8 [16];
  Interval<float> IVar9;
  Interval<float> IVar10;
  Interval<float> IVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  int vb;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  Interval<float> aIStack_2c8 [30];
  bool local_1d8;
  type va;
  undefined1 auStack_1cc [12];
  Interval<float> IStack_1c8;
  Interval<float> IStack_1c0;
  Float FStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  Tuple3<pbrt::Normal3,_float> aTStack_1a8 [2];
  MediumInterface *local_190;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_188;
  Tuple3<pbrt::Vector3,_float> local_180 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_168 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_150 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_138 [2];
  Tuple3<pbrt::Normal3,_float> TStack_120;
  int iStack_114;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_110;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_108;
  Tuple3<pbrt::Vector3,_float> local_100 [3];
  Float FStack_dc;
  Ray local_d8;
  Transform interpRenderFromPrimitive;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  AnimatedTransform::Interpolate(&interpRenderFromPrimitive,&this->renderFromPrimitive,r->time);
  fVar21 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar12._4_4_ = fVar21;
  auVar12._0_4_ = fVar21;
  auVar12._8_4_ = fVar21;
  auVar12._12_4_ = fVar21;
  fVar21 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar8._4_4_ = fVar21;
  auVar8._0_4_ = fVar21;
  auVar8._8_4_ = fVar21;
  auVar8._12_4_ = fVar21;
  fVar21 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar18._4_4_ = fVar21;
  auVar18._0_4_ = fVar21;
  auVar18._8_4_ = fVar21;
  auVar18._12_4_ = fVar21;
  _va = vmovlhps_avx(auVar12,auVar8);
  IStack_1c0 = (Interval<float>)vmovlps_avx(auVar18);
  Transform::ApplyInverse((Point3fi *)local_2d8,&interpRenderFromPrimitive,(Point3fi *)&va);
  fVar21 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar17 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * interpRenderFromPrimitive.mInv.m[1][1])),
                            ZEXT416((uint)fVar1),
                            ZEXT416((uint)interpRenderFromPrimitive.mInv.m[1][0]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * interpRenderFromPrimitive.mInv.m[0][1])),
                           ZEXT416((uint)fVar1),
                           ZEXT416((uint)interpRenderFromPrimitive.mInv.m[0][0]));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * interpRenderFromPrimitive.mInv.m[2][1])),
                            ZEXT416((uint)fVar1),
                            ZEXT416((uint)interpRenderFromPrimitive.mInv.m[2][0]));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar17),
                            ZEXT416((uint)interpRenderFromPrimitive.mInv.m[1][2]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar17),
                           ZEXT416((uint)interpRenderFromPrimitive.mInv.m[0][2]));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar17),
                            ZEXT416((uint)interpRenderFromPrimitive.mInv.m[2][2]));
  fVar21 = auVar12._0_4_;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar8,auVar8);
  auVar13 = vfmadd231ss_fma(auVar13,auVar18,auVar18);
  if (auVar13._0_4_ <= 0.0) {
    auVar13._8_8_ = 0;
    auVar13._0_4_ = aIStack_2c8[0].low;
    auVar13._4_4_ = aIStack_2c8[0].high;
  }
  else {
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar3 = vandps_avx(auVar12,auVar20);
    auVar4 = vandps_avx(auVar8,auVar20);
    auVar20 = vandps_avx(auVar18,auVar20);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ *
                                           ((float)local_2d8._12_4_ - (float)local_2d8._8_4_) * 0.5)
                                    ),ZEXT416((uint)(((float)local_2d8._4_4_ -
                                                     (float)local_2d8._0_4_) * 0.5)),auVar4);
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)((aIStack_2c8[0].high - aIStack_2c8[0].low) * 0.5)
                                           ),auVar20);
    fVar17 = auVar3._0_4_ / auVar13._0_4_;
    fVar1 = auVar8._0_4_ * fVar17;
    IVar9.high = fVar1;
    IVar9.low = fVar1;
    local_328 = ZEXT416((uint)(fVar21 * fVar17));
    local_318 = ZEXT416((uint)(auVar18._0_4_ * fVar17));
    local_308 = auVar12;
    local_2f8 = auVar8;
    local_2e8 = auVar18;
    auVar14._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_2d8,IVar9);
    auVar14._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar14._0_16_);
    local_2d8._0_4_ = (undefined4)uVar2;
    local_2d8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    IVar10.high = (float)local_328._0_4_;
    IVar10.low = (float)local_328._0_4_;
    auVar15._0_8_ = Interval<float>::operator+<float>((Interval<float> *)(local_2d8 + 8),IVar10);
    auVar15._8_56_ = extraout_var_00;
    uVar2 = vmovlps_avx(auVar15._0_16_);
    local_2d8._8_4_ = (undefined4)uVar2;
    local_2d8._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    IVar11.high = (float)local_318._0_4_;
    IVar11.low = (float)local_318._0_4_;
    auVar16._0_8_ = Interval<float>::operator+<float>(aIStack_2c8,IVar11);
    auVar16._8_56_ = extraout_var_01;
    auVar13 = auVar16._0_16_;
    tMax = tMax - fVar17;
    auVar8 = local_2f8;
    auVar12 = local_308;
    auVar18 = local_2e8;
  }
  auVar13 = vhaddps_avx(auVar13,auVar13);
  local_d8.o.super_Tuple3<pbrt::Point3,_float>.z = auVar13._0_4_ * 0.5;
  local_d8.time = r->time;
  local_d8.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar12 = vinsertps_avx(auVar8,auVar12,0x10);
  auVar4._4_4_ = local_2d8._4_4_;
  auVar4._0_4_ = local_2d8._0_4_;
  auVar4._8_4_ = local_2d8._8_4_;
  auVar4._12_4_ = local_2d8._12_4_;
  auVar8 = vinsertps_avx(auVar4,ZEXT416((uint)local_2d8._12_4_),0x10);
  auVar19._0_4_ = (float)local_2d8._4_4_ + auVar8._0_4_;
  auVar19._4_4_ = (float)local_2d8._8_4_ + auVar8._4_4_;
  auVar19._8_4_ = auVar8._8_4_ + 0.0;
  auVar19._12_4_ = auVar8._12_4_ + 0.0;
  auVar3._8_4_ = 0x3f000000;
  auVar3._0_8_ = 0x3f0000003f000000;
  auVar3._12_4_ = 0x3f000000;
  auVar8 = vmulps_avx512vl(auVar19,auVar3);
  local_d8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar8);
  local_d8.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12);
  local_d8.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_;
  PrimitiveHandle::Intersect
            ((optional<pbrt::ShapeIntersection> *)local_2d8,&this->primitive,&local_d8,tMax);
  if (local_1d8 == true) {
    Transform::operator()
              ((SurfaceInteraction *)&va,&interpRenderFromPrimitive,(SurfaceInteraction *)local_2d8)
    ;
    if (local_1d8 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
    }
    IVar6 = _va;
    IVar7 = IStack_1c8;
    vb = 0;
    aIStack_2c8[6] = (Interval<float>)local_190;
    local_2d8._0_4_ = va;
    local_2d8._4_4_ = va._4_4_;
    local_2d8._8_4_ = va._8_4_;
    local_2d8._12_4_ = va._12_4_;
    aIStack_2c8[0] = IStack_1c0;
    aIStack_2c8[1].low = FStack_1b8;
    aIStack_2c8[1].high = fStack_1b4;
    aIStack_2c8[2].low = fStack_1b0;
    aIStack_2c8[2].high = fStack_1ac;
    aIStack_2c8[3].low = aTStack_1a8[0].x;
    aIStack_2c8[3].high = aTStack_1a8[0].y;
    IVar9 = aIStack_2c8[3];
    aIStack_2c8[4].low = aTStack_1a8[0].z;
    aIStack_2c8[4].high = aTStack_1a8[1].x;
    IVar10 = aIStack_2c8[4];
    aIStack_2c8[5].low = aTStack_1a8[1].y;
    aIStack_2c8[5].high = aTStack_1a8[1].z;
    aIStack_2c8[7].low = (float)(undefined4)local_188.bits;
    aIStack_2c8[7].high = (float)local_188.bits._4_4_;
    aIStack_2c8[8].low = local_180[0].x;
    aIStack_2c8[8].high = local_180[0].y;
    aIStack_2c8[9].low = local_180[0].z;
    aIStack_2c8[9].high = local_180[1].x;
    aIStack_2c8[10].low = local_180[1].y;
    aIStack_2c8[10].high = local_180[1].z;
    aIStack_2c8[0xb].low = aTStack_168[0].x;
    aIStack_2c8[0xb].high = aTStack_168[0].y;
    aIStack_2c8[0xc].low = aTStack_168[0].z;
    aIStack_2c8[0xc].high = aTStack_168[1].x;
    aIStack_2c8[0xd].low = aTStack_168[1].y;
    aIStack_2c8[0xd].high = aTStack_168[1].z;
    aIStack_2c8[0xe].low = aTStack_150[0].x;
    aIStack_2c8[0xe].high = aTStack_150[0].y;
    IVar11 = aIStack_2c8[0xe];
    aIStack_2c8[0xf].low = aTStack_150[0].z;
    aIStack_2c8[0xf].high = aTStack_150[1].x;
    IVar5 = aIStack_2c8[0xf];
    aIStack_2c8[0x10].low = aTStack_150[1].y;
    aIStack_2c8[0x10].high = aTStack_150[1].z;
    aIStack_2c8[0x11].low = aTStack_138[0].x;
    aIStack_2c8[0x11].high = aTStack_138[0].y;
    aIStack_2c8[0x12].low = aTStack_138[0].z;
    aIStack_2c8[0x12].high = aTStack_138[1].x;
    aIStack_2c8[0x13].low = aTStack_138[1].y;
    aIStack_2c8[0x13].high = aTStack_138[1].z;
    aIStack_2c8[0x14].low = TStack_120.x;
    aIStack_2c8[0x14].high = TStack_120.y;
    aIStack_2c8[0x15].low = TStack_120.z;
    aIStack_2c8[0x15].high = (float)iStack_114;
    aIStack_2c8[0x16].low = (float)(undefined4)local_110.bits;
    aIStack_2c8[0x16].high = (float)local_110.bits._4_4_;
    aIStack_2c8[0x17].low = (float)(undefined4)local_108.bits;
    aIStack_2c8[0x17].high = (float)local_108.bits._4_4_;
    aIStack_2c8[0x1c].low = local_100[2].z;
    aIStack_2c8[0x1c].high = FStack_dc;
    aIStack_2c8[0x18].low = local_100[0].x;
    aIStack_2c8[0x18].high = local_100[0].y;
    aIStack_2c8[0x19].low = local_100[0].z;
    aIStack_2c8[0x19].high = local_100[1].x;
    aIStack_2c8[0x1a].low = local_100[1].y;
    aIStack_2c8[0x1a].high = local_100[1].z;
    aIStack_2c8[0x1b].low = local_100[2].x;
    aIStack_2c8[0x1b].high = local_100[2].y;
    aIStack_2c8[4].low = (float)aTStack_1a8._8_8_;
    aIStack_2c8[0xf].low = (float)aTStack_150._8_8_;
    aIStack_2c8[3].high = SUB84(aTStack_1a8[0]._0_8_,4);
    aIStack_2c8[3].low = (float)aTStack_1a8[0]._0_8_;
    aIStack_2c8[0xe].high = SUB84(aTStack_150[0]._0_8_,4);
    auVar12 = vfmadd132ss_fma(ZEXT416((uint)aIStack_2c8[3].high),
                              ZEXT416((uint)(aIStack_2c8[4].low * aIStack_2c8[0xf].low)),
                              ZEXT416((uint)aIStack_2c8[0xe].high));
    auVar8 = vfmsub213ss_fma(ZEXT416((uint)aIStack_2c8[0xf].low),ZEXT416((uint)aIStack_2c8[4].low),
                             ZEXT416((uint)(aIStack_2c8[4].low * aIStack_2c8[0xf].low)));
    aIStack_2c8[0xe].low = (float)aTStack_150[0]._0_8_;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ + auVar8._0_4_)),
                              ZEXT416((uint)aIStack_2c8[3].low),ZEXT416((uint)aIStack_2c8[0xe].low))
    ;
    va = auVar12._0_4_;
    if (auVar12._0_4_ < 0.0) {
      aIStack_2c8[3] = IVar9;
      aIStack_2c8[4] = IVar10;
      aIStack_2c8[0xe] = IVar11;
      aIStack_2c8[0xf] = IVar5;
      LogFatal<char_const(&)[36],char_const(&)[2],char_const(&)[36],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/primitive.cpp"
                 ,0xa0,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(char (*) [2])0x621a47,
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(float *)&va,
                 (char (*) [2])0x621a47,&vb);
    }
    __return_storage_ptr__->set = local_1d8;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_190;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)IVar6;
    *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 8) = IVar7;
    *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x10) = IStack_1c0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = _FStack_1b8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = _fStack_1b0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = aTStack_1a8[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = aTStack_1a8._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = aTStack_1a8[1]._4_8_;
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_188.bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_180[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_180._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_180[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = aTStack_168[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = aTStack_168._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = aTStack_168[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = aTStack_150[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = aTStack_150._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = aTStack_150[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = aTStack_150._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = aTStack_150[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = aTStack_138[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = aTStack_138._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = aTStack_138[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = TStack_120._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = stack0xfffffffffffffee8;
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_110.bits;
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 200) = local_108.bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = local_100[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_100._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = local_100[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_100[2]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = stack0xffffffffffffff20;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = aIStack_2c8[0x1d].low;
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> AnimatedPrimitive::Intersect(const Ray &r,
                                                               Float tMax) const {
    // Compute _ray_ after transformation by _renderFromPrimitive_
    Transform interpRenderFromPrimitive = renderFromPrimitive.Interpolate(r.time);
    Ray ray = interpRenderFromPrimitive.ApplyInverse(r, &tMax);
    pstd::optional<ShapeIntersection> si = primitive.Intersect(ray, tMax);
    if (!si)
        return {};

    // Transform instance's intersection data to render space
    si->intr = interpRenderFromPrimitive(si->intr);
    CHECK_GE(Dot(si->intr.n, si->intr.shading.n), 0);
    return si;
}